

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_skip_bytes(mpack_reader_t *reader,size_t count)

{
  char *pcVar1;
  char *pcVar2;
  char *min_bytes;
  
  if (reader->error != mpack_ok) {
    return;
  }
  if (count <= (ulong)((long)reader->end - (long)reader->data)) {
    reader->data = reader->data + count;
    return;
  }
  if (reader->fill == (mpack_reader_fill_t)0x0) {
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_invalid;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_invalid);
        return;
      }
    }
    return;
  }
  min_bytes = reader->data + (count - (long)reader->end);
  reader->data = reader->end;
  if (reader->skip != (mpack_reader_skip_t)0x0) {
    if ((char *)(reader->size >> 4) < min_bytes) {
      (*reader->skip)(reader,(size_t)min_bytes);
      return;
    }
    mpack_reader_skip_using_fill(reader,(size_t)min_bytes);
    return;
  }
  pcVar2 = (char *)reader->size;
  if (pcVar2 < min_bytes) {
    do {
      pcVar1 = (char *)mpack_fill_range(reader,reader->buffer,(size_t)pcVar2,(size_t)pcVar2);
      pcVar2 = (char *)reader->size;
      if (pcVar1 < pcVar2) goto LAB_0010a5c2;
      min_bytes = min_bytes + -(long)pcVar2;
    } while (pcVar2 < min_bytes);
  }
  reader->data = reader->buffer;
  pcVar2 = (char *)mpack_fill_range(reader,reader->buffer,(size_t)min_bytes,(size_t)pcVar2);
  if (pcVar2 < min_bytes) {
LAB_0010a5c2:
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_io;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_io);
        return;
      }
    }
  }
  else {
    reader->end = reader->data + (long)pcVar2;
    reader->data = reader->data + (long)min_bytes;
  }
  return;
}

Assistant:

void mpack_skip_bytes(mpack_reader_t* reader, size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return;
    mpack_log("skip requested for %i bytes\n", (int)count);
    mpack_reader_track_bytes(reader, count);

    // check if we have enough in the buffer already
    size_t left = (size_t)(reader->end - reader->data);
    if (left >= count) {
        mpack_log("skipping %i bytes still in buffer\n", (int)count);
        reader->data += count;
        return;
    }

    mpack_skip_bytes_straddle(reader, count);
}